

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    string *filename,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *in_stack_00000238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  LodePNGColorType in_stack_ffffffffffffffc4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x298521);
  load_file(in_stack_00000240,in_stack_00000238);
  uVar1 = decode(in_RCX,(uint *)CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffb0);
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const std::string& filename,
                LodePNGColorType colortype, unsigned bitdepth)
{
  std::vector<unsigned char> buffer;
  load_file(buffer, filename);
  return decode(out, w, h, buffer, colortype, bitdepth);
}